

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

spv_result_t
spvBinaryParse(spv_const_context context,void *user_data,uint32_t *code,size_t num_words,
              spv_parsed_header_fn_t parsed_header,spv_parsed_instruction_fn_t parsed_instruction,
              spv_diagnostic *diagnostic)

{
  mapped_type mVar1;
  _Manager_type p_Var2;
  _Hash_node_base *p_Var3;
  undefined2 uVar4;
  undefined4 endian;
  bool bVar5;
  spv_result_t sVar6;
  spv_ext_inst_type_t sVar7;
  spv_operand_type_t sVar8;
  spv_operand_type_t sVar9;
  int32_t iVar10;
  uint32_t uVar11;
  spv_opcode_desc psVar12;
  iterator iVar13;
  undefined8 uVar14;
  iterator iVar15;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  DiagnosticStream *pDVar18;
  _Hash_node_base *p_Var19;
  _Hash_node_base **__s;
  _Hash_node_base *p_Var20;
  uint uVar21;
  Capability *pCVar22;
  _Hash_node_base *p_Var23;
  long lVar24;
  ulong uVar25;
  size_type __n;
  ulong uVar26;
  uint16_t uVar27;
  uint uVar28;
  Op OVar29;
  uint *puVar30;
  char *pcVar31;
  spv_operand_type_t *types;
  spv_operand_type_t sVar32;
  ushort uVar33;
  int iVar34;
  spv_operand_type_t sVar35;
  Capability *inst_offset;
  long lVar36;
  undefined1 auVar37 [16];
  uint16_t inst_word_count;
  spv_operand_desc entry;
  spv_opcode_desc opcode_desc;
  uint32_t first_word;
  uint32_t word;
  spv_parsed_instruction_t inst;
  spv_header_t header;
  spv_const_binary_t binary;
  spv_operand_desc entry_2;
  uint16_t local_472;
  spv_parsed_operand_t local_470;
  Capability *local_460;
  spv_ext_inst_desc local_458;
  ulong local_450;
  undefined1 local_448 [24];
  spv_opcode_desc local_430;
  Capability *local_428;
  spv_operand_type_t local_420;
  spv_operand_type_t local_41c;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined8 local_3f8;
  uint *local_3e8;
  undefined1 local_3e0 [24];
  spv_ext_inst_table local_3c8;
  Parser *local_3c0;
  void *local_3b8;
  spv_parsed_header_fn_t local_3b0;
  spv_parsed_instruction_fn_t local_3a8;
  undefined1 local_3a0 [160];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_300;
  spv_parsed_operand_t *local_2c8;
  iterator local_2c0;
  spv_parsed_operand_t *local_2b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2b0;
  spv_operand_pattern_t local_298;
  ulong local_280;
  spv_header_t local_278;
  undefined1 local_258 [48];
  _Manager_type local_228;
  _Invoker_type p_Stack_220;
  spv_const_binary_t local_218;
  DiagnosticStream local_208;
  
  local_258._0_4_ = context->target_env;
  local_258._4_4_ = *(undefined4 *)&context->field_0x4;
  local_258._8_8_ = context->opcode_table;
  local_258._16_8_ = context->operand_table;
  local_258._24_8_ = context->ext_inst_table;
  local_258._32_8_ = (void *)0x0;
  local_258._40_8_ = 0;
  local_228 = (_Manager_type)0x0;
  p_Stack_220 = (_Invoker_type)0x0;
  p_Var2 = (context->consumer).super__Function_base._M_manager;
  local_460 = (Capability *)num_words;
  local_448._16_8_ = code;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)(local_258 + 0x20),(_Any_data *)&context->consumer,__clone_functor);
    local_228 = (context->consumer).super__Function_base._M_manager;
    p_Stack_220 = (context->consumer)._M_invoker;
  }
  if (diagnostic != (spv_diagnostic *)0x0) {
    *diagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer((spv_context)local_258,diagnostic);
  }
  local_3e0._0_4_ = local_258._0_4_;
  local_3e0._16_4_ = (int)local_258._8_8_;
  local_3e0._8_8_ = local_258._16_8_;
  local_3e0._20_4_ = SUB84(local_258._8_8_,4);
  local_3c8 = (spv_ext_inst_table)local_258._24_8_;
  local_3c0 = (Parser *)(local_258 + 0x20);
  local_3b8 = user_data;
  local_3b0 = parsed_header;
  local_3a8 = parsed_instruction;
  anon_unknown.dwarf_474aba::Parser::State::State
            ((State *)local_3a0,(uint32_t *)0x0,0,(spv_diagnostic *)0x0);
  anon_unknown.dwarf_474aba::Parser::State::State
            ((State *)&local_208,(uint32_t *)local_448._16_8_,(size_t)local_460,diagnostic);
  anon_unknown.dwarf_474aba::Parser::State::operator=((State *)local_3a0,(State *)&local_208);
  anon_unknown.dwarf_474aba::Parser::State::~State((State *)&local_208);
  if ((uint32_t *)local_3a0._0_8_ == (uint32_t *)0x0) {
    anon_unknown.dwarf_474aba::Parser::diagnostic
              (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
    pcVar31 = "Missing module.";
    lVar24 = 0xf;
LAB_001af781:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar31,lVar24);
  }
  else {
    if ((Capability *)0x4 < (ulong)local_3a0._8_8_) {
      local_218.code = (uint32_t *)local_3a0._0_8_;
      local_218.wordCount = local_3a0._8_8_;
      sVar6 = spvBinaryEndianness(&local_218,(spv_endianness_t *)(local_3a0 + 0x28));
      if (sVar6 == SPV_SUCCESS) {
        local_3a0[0x2c] = spvIsHostEndian(local_3a0._40_4_);
        local_3a0[0x2c] = !local_3a0[0x2c];
        sVar6 = spvBinaryHeaderGet(&local_218,local_3a0._40_4_,&local_278);
        if (sVar6 == SPV_SUCCESS) {
          if ((local_3b0 == (spv_parsed_header_fn_t)0x0) ||
             (sVar7 = (*local_3b0)(local_3b8,local_3a0._40_4_,local_278.magic,local_278.version,
                                   local_278.generator,local_278.bound,local_278.schema),
             sVar7 == SPV_EXT_INST_TYPE_NONE)) {
            local_3a0._24_8_ = (Capability *)0x5;
LAB_001af953:
            if ((ulong)local_3a0._24_8_ < (ulong)local_3a0._8_8_) {
              local_3a0._32_8_ = local_3a0._32_8_ + 1;
              local_408 = (undefined1  [16])0x0;
              local_418 = (undefined1  [16])0x0;
              local_3f8._0_2_ = 0;
              local_3f8._2_6_ = 0;
              local_420 = anon_unknown.dwarf_474aba::Parser::peekAt
                                    ((Parser *)local_3e0,local_3a0._24_8_);
              if (local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
              }
              if (local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_2b0,
                           (iterator)
                           local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_420);
              }
              else {
                *local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_420;
                local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              if (local_2c0._M_current != local_2c8) {
                local_2c0._M_current = local_2c8;
              }
              if ((ulong)local_3a0._8_8_ <= (ulong)local_3a0._24_8_) {
                __assert_fail("_.word_index < _.num_words",
                              "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                              ,0x138,
                              "spv_result_t (anonymous namespace)::Parser::parseInstruction()");
              }
              local_472 = 0;
              spvOpcodeSplit(local_420,&local_472,(uint16_t *)(local_418 + 10));
              if (local_472 == 0) {
                anon_unknown.dwarf_474aba::Parser::diagnostic
                          (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Invalid instruction word count: ",0x20);
LAB_001afad5:
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                sVar7 = local_208.error_;
LAB_001afae7:
                spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
              }
              else {
                sVar6 = spvtools::AssemblyGrammar::lookupOpcode
                                  ((AssemblyGrammar *)local_3e0,(uint)(ushort)local_418._10_2_,
                                   &local_430);
                if (sVar6 != SPV_SUCCESS) {
                  anon_unknown.dwarf_474aba::Parser::diagnostic
                            (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"Invalid opcode: ",0x10);
                  goto LAB_001afad5;
                }
                local_460 = (Capability *)local_3a0._24_8_;
                local_448._16_8_ = local_3a0._24_8_ + 1;
                if (local_298.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_298.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  local_298.
                  super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_298.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                }
                uVar21 = (uint)local_430->numTypes;
                inst_offset = (Capability *)local_3a0._24_8_;
                local_3a0._24_8_ = local_448._16_8_;
                if (local_430->numTypes != 0) {
                  uVar28 = 0;
                  iVar34 = -1;
                  psVar12 = local_430;
                  do {
                    if (local_298.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_298.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
                      _M_realloc_insert<spv_operand_type_t_const&>
                                ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)
                                 &local_298,
                                 (iterator)
                                 local_298.
                                 super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,
                                 psVar12->operandTypes + (int)(uVar21 + iVar34));
                      psVar12 = local_430;
                    }
                    else {
                      *local_298.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish =
                           psVar12->operandTypes[(int)(uVar21 + iVar34)];
                      local_298.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_298.
                           super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    uVar28 = uVar28 + 1;
                    uVar21 = (uint)psVar12->numTypes;
                    iVar34 = iVar34 + -1;
                    inst_offset = local_460;
                  } while (uVar28 < uVar21);
                }
                do {
                  uVar25 = (ulong)local_472;
                  pCVar22 = (Capability *)((long)inst_offset + uVar25);
                  if (pCVar22 <= (ulong)local_3a0._24_8_) {
                    if (local_298.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_start ==
                        local_298.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
LAB_001b09d1:
                      if (pCVar22 == (Capability *)local_3a0._24_8_) {
                        if (local_3a0[0x2c] == true) {
                          if ((long)local_2b0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2b0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2 != uVar25) {
                            __assert_fail("!_.requires_endian_conversion || (inst_word_count == _.endian_converted_words.size())"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                          ,0x180,
                                          "spv_result_t (anonymous namespace)::Parser::parseInstruction()"
                                         );
                          }
                        }
                        else if ((long)local_2b0.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2b0.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start != 4) {
                          __assert_fail("_.requires_endian_conversion || (_.endian_converted_words.size() == 1)"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                        ,0x182,
                                        "spv_result_t (anonymous namespace)::Parser::parseInstruction()"
                                       );
                        }
                        uVar4 = local_418._10_2_;
                        OVar29 = (Op)(ushort)local_418._10_2_;
                        iVar10 = spvOpcodeGeneratesType(OVar29);
                        pCVar22 = local_460;
                        if (iVar10 == 0) goto LAB_001b0efc;
                        if (OVar29 == OpTypeFloat) {
                          iVar34 = 3;
LAB_001b0cad:
                          sVar8 = anon_unknown.dwarf_474aba::Parser::peekAt
                                            ((Parser *)local_3e0,(size_t)((long)pCVar22 + 2));
                        }
                        else {
                          sVar8 = SPV_OPERAND_TYPE_NONE;
                          iVar34 = 0;
                          if (uVar4 == 0x15) {
                            uVar11 = anon_unknown.dwarf_474aba::Parser::peekAt
                                               ((Parser *)local_3e0,(size_t)((long)local_460 + 3));
                            iVar34 = 2 - (uint)(uVar11 == 0);
                            goto LAB_001b0cad;
                          }
                        }
                        uVar14 = local_408._0_8_;
                        uVar26 = (ulong)(uint)local_408._4_4_;
                        uVar25 = uVar26 % (ulong)local_3a0._112_8_;
                        if (*(_Hash_node_base **)(local_3a0._104_8_ + uVar25 * 8) ==
                            (_Hash_node_base *)0x0) goto LAB_001b0d15;
                        p_Var19 = (*(_Hash_node_base **)(local_3a0._104_8_ + uVar25 * 8))->_M_nxt;
                        sVar9 = *(spv_operand_type_t *)&p_Var19[1]._M_nxt;
                        goto joined_r0x001b0ced;
                      }
                      anon_unknown.dwarf_474aba::Parser::diagnostic
                                (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid word count: Op",0x16);
                      pDVar18 = spvtools::DiagnosticStream::operator<<(&local_208,&local_430->name);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar18," starting at word ",0x12);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar18);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar18," says it has ",0xd);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar18);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar18," words, but found ",0x12);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar18);
                      lVar24 = 0xf;
                      pcVar31 = " words instead.";
                    }
                    else {
                      bVar5 = spvOperandIsOptional
                                        (local_298.
                                         super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                         ._M_impl.super__Vector_impl_data._M_finish[-1]);
                      if (bVar5) {
                        uVar25 = (ulong)local_472;
                        pCVar22 = (Capability *)((long)inst_offset + uVar25);
                        goto LAB_001b09d1;
                      }
                      anon_unknown.dwarf_474aba::Parser::diagnostic
                                (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"End of input reached while decoding Op",0x26
                                );
                      pDVar18 = spvtools::DiagnosticStream::operator<<(&local_208,&local_430->name);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar18," starting at word ",0x12);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar18);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar18,": expected more operands after ",0x1f);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar18);
                      lVar24 = 7;
                      pcVar31 = " words.";
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar18,pcVar31,lVar24);
                    sVar7 = pDVar18->error_;
                    goto LAB_001afae7;
                  }
                  if (local_298.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                      local_298.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    anon_unknown.dwarf_474aba::Parser::diagnostic
                              (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Invalid instruction Op",0x16);
                    pDVar18 = spvtools::DiagnosticStream::operator<<(&local_208,&local_430->name);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar18," starting at word ",0x12);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar18);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar18,": expected no more operands after ",0x22);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar18);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar18," words, but stated word count is ",0x21);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar18);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar18,".",1);
                    sVar7 = pDVar18->error_;
                    goto LAB_001afae7;
                  }
                  sVar8 = spvTakeFirstMatchableOperand(&local_298);
                  OVar29 = (Op)(ushort)local_418._10_2_;
                  uVar27 = (short)local_3a0._24_8_ - (short)inst_offset;
                  local_470.num_words = 1;
                  local_470.number_kind = SPV_NUMBER_NONE;
                  local_470.number_bit_width = 0;
                  local_470.offset = uVar27;
                  local_470.type = sVar8;
                  if ((ulong)local_3a0._8_8_ <= (ulong)local_3a0._24_8_) {
                    sVar7 = anon_unknown.dwarf_474aba::Parser::exhaustedInputDiagnostic
                                      ((Parser *)local_3e0,(size_t)inst_offset,OVar29,sVar8);
                    goto LAB_001b0314;
                  }
                  sVar9 = anon_unknown.dwarf_474aba::Parser::peekAt
                                    ((Parser *)local_3e0,local_3a0._24_8_);
                  sVar6 = (spv_result_t)local_3a0._32_8_;
                  local_41c = sVar9;
                  switch(sVar8) {
                  case SPV_OPERAND_TYPE_ID:
                  case SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE:
                    if (sVar9 == SPV_OPERAND_TYPE_NONE) {
                      anon_unknown.dwarf_474aba::Parser::diagnostic(&local_208,local_3c0,sVar6);
                      lVar24 = 7;
                      pcVar31 = "Id is 0";
                      goto LAB_001b086e;
                    }
                    local_470.type = SPV_OPERAND_TYPE_ID;
                    bVar5 = spvIsExtendedInstruction(OVar29);
                    if (uVar27 == 3 && bVar5) {
                      iVar13 = std::
                               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)(local_3a0 + 0xa0),&local_41c);
                      if (iVar13.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_false>
                          ._M_cur == (__node_type *)0x0) {
                        anon_unknown.dwarf_474aba::Parser::diagnostic
                                  (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"OpExtInst set Id ",0x11);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar24 = 0x30;
                        pcVar31 = " does not reference an OpExtInstImport result Id";
                        goto LAB_001b086e;
                      }
                      local_418._12_4_ =
                           *(undefined4 *)
                            ((long)iVar13.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_false>
                                   ._M_cur + 0xc);
                    }
                    break;
                  case SPV_OPERAND_TYPE_TYPE_ID:
                    if (sVar9 == SPV_OPERAND_TYPE_NONE) {
                      anon_unknown.dwarf_474aba::Parser::diagnostic(&local_208,local_3c0,sVar6);
                      lVar24 = 0x13;
                      pcVar31 = "Error: Type Id is 0";
                      goto LAB_001b086e;
                    }
                    local_408._0_4_ = sVar9;
                    break;
                  case SPV_OPERAND_TYPE_RESULT_ID:
                    if (sVar9 == SPV_OPERAND_TYPE_NONE) {
                      anon_unknown.dwarf_474aba::Parser::diagnostic(&local_208,local_3c0,sVar6);
                      lVar24 = 0x15;
                      pcVar31 = "Error: Result Id is 0";
                    }
                    else {
                      local_408._4_4_ = sVar9;
                      iVar15 = std::
                               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)(local_3a0 + 0x30),(key_type *)(local_408 + 4));
                      if (iVar15.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                          ._M_cur == (__node_type *)0x0) {
                        iVar10 = spvOpcodeGeneratesType(OVar29);
                        mVar1 = *(mapped_type *)(local_408 + (ulong)(iVar10 != 0) * 4);
                        pmVar17 = std::__detail::
                                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                *)(local_3a0 + 0x30),(key_type *)(local_408 + 4));
                        *pmVar17 = mVar1;
                        break;
                      }
                      anon_unknown.dwarf_474aba::Parser::diagnostic
                                (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Id ",3);
                      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                      lVar24 = 0x1a;
                      pcVar31 = " is defined more than once";
                    }
                    goto LAB_001b086e;
                  case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
                  case SPV_OPERAND_TYPE_SCOPE_ID:
                    if (sVar9 == SPV_OPERAND_TYPE_NONE) {
                      anon_unknown.dwarf_474aba::Parser::diagnostic(&local_208,local_3c0,sVar6);
                      local_458 = (spv_ext_inst_desc)spvOperandTypeStr(sVar8);
                      pDVar18 = spvtools::DiagnosticStream::operator<<
                                          (&local_208,(char **)&local_458);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar18," is 0",5);
                      sVar7 = pDVar18->error_;
                      goto LAB_001afd45;
                    }
                    break;
                  case SPV_OPERAND_TYPE_LITERAL_INTEGER:
                  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER:
                    uVar14 = 0x100000006;
                    goto LAB_001b04e0;
                  case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
                    bVar5 = spvIsExtendedInstruction(OVar29);
                    if (!bVar5) {
                      __assert_fail("spvIsExtendedInstruction(opcode)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                    ,0x1f1,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    if (local_418._12_4_ == SPV_EXT_INST_TYPE_NONE) {
                      __assert_fail("inst->ext_inst_type != SPV_EXT_INST_TYPE_NONE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                    ,0x1f2,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    sVar6 = spvtools::AssemblyGrammar::lookupExtInst
                                      ((AssemblyGrammar *)local_3e0,local_418._12_4_,sVar9,
                                       &local_458);
                    if (sVar6 == SPV_SUCCESS) {
                      types = local_458->operandTypes;
LAB_001b01f0:
                      spvPushOperandTypes(types,&local_298);
                    }
                    else {
                      bVar5 = spvExtInstIsNonSemantic(local_418._12_4_);
                      if (!bVar5) {
                        anon_unknown.dwarf_474aba::Parser::diagnostic
                                  (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Invalid extended instruction number: ",
                                   0x25);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        sVar7 = local_208.error_;
                        goto LAB_001afd45;
                      }
                      local_208._0_4_ = 0x34;
                      if (local_298.
                          super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish ==
                          local_298.
                          super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
                        _M_realloc_insert<spv_operand_type_t>
                                  (&local_298,
                                   (iterator)
                                   local_298.
                                   super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                   (spv_operand_type_t *)&local_208);
                      }
                      else {
                        *local_298.
                         super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish =
                             SPV_OPERAND_TYPE_FIRST_VARIABLE_TYPE;
                        local_298.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish =
                             local_298.
                             super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 1;
                      }
                    }
                    break;
                  case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
                    if (OVar29 != OpSpecConstantOp) {
                      __assert_fail("spv::Op::OpSpecConstantOp == opcode",
                                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                    ,0x207,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    if (((int)sVar9 < 0) ||
                       (sVar6 = spvtools::AssemblyGrammar::lookupSpecConstantOpcode
                                          ((AssemblyGrammar *)local_3e0,sVar9), sVar6 != SPV_SUCCESS
                       )) {
                      anon_unknown.dwarf_474aba::Parser::diagnostic
                                (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid ",8);
                      local_458 = (spv_ext_inst_desc)
                                  spvOperandTypeStr(SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER);
                      pDVar18 = spvtools::DiagnosticStream::operator<<
                                          (&local_208,(char **)&local_458);
                      lVar24 = 2;
                      pcVar31 = ": ";
                      goto LAB_001afd2c;
                    }
                    local_458 = (spv_ext_inst_desc)0x0;
                    sVar6 = spvtools::AssemblyGrammar::lookupOpcode
                                      ((AssemblyGrammar *)local_3e0,sVar9,
                                       (spv_opcode_desc *)&local_458);
                    if (sVar6 == SPV_SUCCESS) {
                      if (*(byte *)((long)local_458->operandTypes + 0x55) == 0) {
                        __assert_fail("opcode_entry->hasType",
                                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                      ,0x215,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      if ((char)local_458->operandTypes[0x15] == SPV_OPERAND_TYPE_NONE) {
                        __assert_fail("opcode_entry->hasResult",
                                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                      ,0x216,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      if ((ushort)(short)local_458->operandTypes[4] < SPV_OPERAND_TYPE_TYPE_ID) {
                        __assert_fail("opcode_entry->numTypes >= 2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                      ,0x217,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      types = local_458->operandTypes + 7;
                      goto LAB_001b01f0;
                    }
                    anon_unknown.dwarf_474aba::Parser::diagnostic
                              (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                    lVar24 = 0x27;
                    pcVar31 = "OpSpecConstant opcode table out of sync";
LAB_001b086e:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,pcVar31,lVar24);
                    sVar7 = local_208.error_;
LAB_001afd45:
                    spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                    inst_offset = local_460;
                    goto LAB_001b0314;
                  case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
                  case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
                    local_470.type = SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER;
                    if ((OVar29 != OpConstant) && (OVar29 != OpSpecConstant)) {
                      if (OVar29 != OpSwitch) {
                        __assert_fail("opcode == spv::Op::OpConstant || opcode == spv::Op::OpSpecConstant"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                      ,0x24a,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      uVar11 = anon_unknown.dwarf_474aba::Parser::peekAt
                                         ((Parser *)local_3e0,local_448._16_8_);
                      local_458 = (spv_ext_inst_desc)CONCAT44(local_458._4_4_,uVar11);
                      iVar15 = std::
                               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)(local_3a0 + 0x30),(key_type *)&local_458);
                      if ((iVar15.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                           ._M_cur == (__node_type *)0x0) ||
                         (uVar11 = *(uint32_t *)
                                    ((long)iVar15.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                           ._M_cur + 0xc), uVar11 == 0)) {
                        anon_unknown.dwarf_474aba::Parser::diagnostic
                                  (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Invalid OpSwitch: selector id ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar24 = 0xc;
                        pcVar31 = " has no type";
                      }
                      else if ((uint32_t)local_458 == uVar11) {
                        anon_unknown.dwarf_474aba::Parser::diagnostic
                                  (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Invalid OpSwitch: selector id ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar24 = 0x17;
                        pcVar31 = " is a type, not a value";
                      }
                      else {
                        sVar7 = anon_unknown.dwarf_474aba::Parser::setNumericTypeInfoForType
                                          ((Parser *)local_3e0,&local_470,uVar11);
                        inst_offset = local_460;
                        if (sVar7 != SPV_EXT_INST_TYPE_NONE) goto LAB_001b0314;
                        if (0xfffffffd < local_470.number_kind - SPV_NUMBER_FLOATING) break;
                        anon_unknown.dwarf_474aba::Parser::diagnostic
                                  (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Invalid OpSwitch: selector id ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar24 = 0x18;
                        pcVar31 = " is not a scalar integer";
                      }
                      goto LAB_001b086e;
                    }
                    if (local_408._0_4_ == SPV_OPERAND_TYPE_NONE) {
                      __assert_fail("inst->type_id",
                                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                    ,0x24d,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    sVar7 = anon_unknown.dwarf_474aba::Parser::setNumericTypeInfoForType
                                      ((Parser *)local_3e0,&local_470,local_408._0_4_);
                    inst_offset = local_460;
                    if (sVar7 != SPV_EXT_INST_TYPE_NONE) goto LAB_001b0314;
                    break;
                  case SPV_OPERAND_TYPE_LITERAL_FLOAT:
                    uVar14 = 0x30000000a;
LAB_001b04e0:
                    local_470.type = (spv_operand_type_t)uVar14;
                    local_470.number_kind = (spv_number_kind_t)((ulong)uVar14 >> 0x20);
                    local_470.number_bit_width = 0x20;
                    break;
                  case SPV_OPERAND_TYPE_LITERAL_STRING:
                  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING:
                    local_458 = (spv_ext_inst_desc)local_448;
                    local_450 = 0;
                    local_448[0] = 0;
                    lVar24 = local_3a0._8_8_ - local_3a0._24_8_;
                    if (lVar24 == 0) {
LAB_001aff2b:
                      sVar7 = anon_unknown.dwarf_474aba::Parser::exhaustedInputDiagnostic
                                        ((Parser *)local_3e0,(size_t)inst_offset,OVar29,sVar8);
LAB_001aff43:
                      bVar5 = false;
                    }
                    else {
                      local_3e8 = (uint *)(local_3a0._0_8_ + local_3a0._8_8_ * 4);
                      puVar30 = (uint *)(local_3a0._0_8_ + local_3a0._24_8_ * 4);
                      do {
                        uVar21 = *puVar30;
                        lVar36 = 0;
                        do {
                          if ((char)(uVar21 >> ((byte)lVar36 & 0x1f)) == '\0') goto LAB_001aff14;
                          std::__cxx11::string::push_back((char)&local_458);
                          lVar36 = lVar36 + 8;
                        } while (lVar36 != 0x20);
                        puVar30 = puVar30 + 1;
                      } while (puVar30 != local_3e8);
LAB_001aff14:
                      sVar7 = (spv_ext_inst_type_t)puVar30;
                      inst_offset = local_460;
                      if (local_450 == lVar24 * 4) goto LAB_001aff2b;
                      uVar33 = (short)(local_450 >> 2) + 1;
                      if (0x3fffb < local_450) {
                        anon_unknown.dwarf_474aba::Parser::diagnostic
                                  (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Literal string is longer than ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208," words: ",8);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar24 = 0xb;
                        pcVar31 = " words long";
LAB_001b077e:
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,pcVar31,lVar24);
                        sVar7 = local_208.error_;
                        spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                        goto LAB_001aff43;
                      }
                      local_470.type = SPV_OPERAND_TYPE_LITERAL_STRING;
                      bVar5 = true;
                      local_470.num_words = uVar33;
                      if (OVar29 == OpExtInstImport) {
                        sVar7 = spvExtInstImportTypeGet((char *)local_458);
                        if (sVar7 == SPV_EXT_INST_TYPE_NONE) {
                          anon_unknown.dwarf_474aba::Parser::diagnostic
                                    (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_208,"Invalid extended instruction import \'",
                                     0x25);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_208,(char *)local_458,local_450);
                          lVar24 = 1;
                          pcVar31 = "\'";
                          goto LAB_001b077e;
                        }
                        if (local_408._4_4_ == SPV_OPERAND_TYPE_NONE) {
                          __assert_fail("inst->result_id",
                                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                        ,0x276,
                                        "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                       );
                        }
                        pmVar16 = std::__detail::
                                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                *)(local_3a0 + 0xa0),(key_type *)(local_408 + 4));
                        *pmVar16 = sVar7;
                      }
                    }
                    if (local_458 != (spv_ext_inst_desc)local_448) {
                      operator_delete(local_458,CONCAT71(local_448._1_7_,local_448[0]) + 1);
                    }
                    inst_offset = local_460;
                    if (!bVar5) goto LAB_001b0314;
                    break;
                  case SPV_OPERAND_TYPE_SOURCE_LANGUAGE:
                    sVar6 = spvtools::AssemblyGrammar::lookupOperand
                                      ((AssemblyGrammar *)local_3e0,SPV_OPERAND_TYPE_SOURCE_LANGUAGE
                                       ,sVar9,(spv_operand_desc *)&local_458);
                    if (sVar6 == SPV_SUCCESS) {
LAB_001b01e4:
                      types = local_458->operandTypes + 8;
                      goto LAB_001b01f0;
                    }
                    anon_unknown.dwarf_474aba::Parser::diagnostic
                              (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Invalid ",8);
                    local_428 = (Capability *)spvOperandTypeStr(SPV_OPERAND_TYPE_SOURCE_LANGUAGE);
                    pDVar18 = spvtools::DiagnosticStream::operator<<(&local_208,(char **)&local_428)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar18," operand: ",10);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar18);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar18,
                               ", if you are creating a new source language please use value 0 (Unknown) and when ready, add your source language to SPIRV-Headers"
                               ,0x82);
                    goto LAB_001afd3b;
                  case SPV_OPERAND_TYPE_EXECUTION_MODEL:
                  case SPV_OPERAND_TYPE_ADDRESSING_MODEL:
                  case SPV_OPERAND_TYPE_MEMORY_MODEL:
                  case SPV_OPERAND_TYPE_EXECUTION_MODE:
                  case SPV_OPERAND_TYPE_STORAGE_CLASS:
                  case SPV_OPERAND_TYPE_DIMENSIONALITY:
                  case SPV_OPERAND_TYPE_SAMPLER_ADDRESSING_MODE:
                  case SPV_OPERAND_TYPE_SAMPLER_FILTER_MODE:
                  case SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT:
                  case SPV_OPERAND_TYPE_FP_ROUNDING_MODE:
                  case SPV_OPERAND_TYPE_LINKAGE_TYPE:
                  case SPV_OPERAND_TYPE_ACCESS_QUALIFIER:
                  case SPV_OPERAND_TYPE_FUNCTION_PARAMETER_ATTRIBUTE:
                  case SPV_OPERAND_TYPE_DECORATION:
                  case SPV_OPERAND_TYPE_BUILT_IN:
                  case SPV_OPERAND_TYPE_GROUP_OPERATION:
                  case SPV_OPERAND_TYPE_KERNEL_ENQ_FLAGS:
                  case SPV_OPERAND_TYPE_KERNEL_PROFILING_INFO:
                  case SPV_OPERAND_TYPE_CAPABILITY:
                  case SPV_OPERAND_TYPE_FPENCODING:
                  case SPV_OPERAND_TYPE_OPTIONAL_ACCESS_QUALIFIER:
                  case SPV_OPERAND_TYPE_OPTIONAL_FPENCODING:
                  case SPV_OPERAND_TYPE_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
                  case SPV_OPERAND_TYPE_DEBUG_COMPOSITE_TYPE:
                  case SPV_OPERAND_TYPE_DEBUG_TYPE_QUALIFIER:
                  case SPV_OPERAND_TYPE_DEBUG_OPERATION:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_COMPOSITE_TYPE:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_TYPE_QUALIFIER:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_IMPORTED_ENTITY:
                  case SPV_OPERAND_TYPE_FPDENORM_MODE:
                  case SPV_OPERAND_TYPE_FPOPERATION_MODE:
                  case SPV_OPERAND_TYPE_QUANTIZATION_MODES:
                  case SPV_OPERAND_TYPE_OVERFLOW_MODES:
                  case SPV_OPERAND_TYPE_RAY_FLAGS:
                  case SPV_OPERAND_TYPE_RAY_QUERY_INTERSECTION:
                  case SPV_OPERAND_TYPE_RAY_QUERY_COMMITTED_INTERSECTION_TYPE:
                  case SPV_OPERAND_TYPE_RAY_QUERY_CANDIDATE_INTERSECTION_TYPE:
                  case SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT:
                  case SPV_OPERAND_TYPE_OPTIONAL_PACKED_VECTOR_FORMAT:
                  case SPV_OPERAND_TYPE_HOST_ACCESS_QUALIFIER:
                  case SPV_OPERAND_TYPE_LOAD_CACHE_CONTROL:
                  case SPV_OPERAND_TYPE_STORE_CACHE_CONTROL:
                  case SPV_OPERAND_TYPE_NAMED_MAXIMUM_NUMBER_OF_REGISTERS:
                    if (sVar8 == SPV_OPERAND_TYPE_OPTIONAL_ACCESS_QUALIFIER) {
                      sVar35 = SPV_OPERAND_TYPE_ACCESS_QUALIFIER;
LAB_001afca1:
                      sVar32 = sVar35;
                      local_470.type = sVar35;
                    }
                    else {
                      if (sVar8 == SPV_OPERAND_TYPE_OPTIONAL_PACKED_VECTOR_FORMAT) {
                        sVar35 = SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT;
                        goto LAB_001afca1;
                      }
                      sVar35 = SPV_OPERAND_TYPE_FPENCODING;
                      sVar32 = sVar8;
                      if (sVar8 == SPV_OPERAND_TYPE_OPTIONAL_FPENCODING) goto LAB_001afca1;
                    }
                    sVar6 = spvtools::AssemblyGrammar::lookupOperand
                                      ((AssemblyGrammar *)local_3e0,sVar8,sVar9,
                                       (spv_operand_desc *)&local_458);
                    if (sVar6 == SPV_SUCCESS) goto LAB_001b01e4;
                    anon_unknown.dwarf_474aba::Parser::diagnostic
                              (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Invalid ",8);
                    local_428 = (Capability *)spvOperandTypeStr(sVar32);
                    pDVar18 = spvtools::DiagnosticStream::operator<<(&local_208,(char **)&local_428)
                    ;
                    lVar24 = 10;
                    pcVar31 = " operand: ";
LAB_001afd2c:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar18,pcVar31,lVar24);
LAB_001afd33:
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar18);
LAB_001afd3b:
                    sVar7 = pDVar18->error_;
                    goto LAB_001afd45;
                  default:
                    anon_unknown.dwarf_474aba::Parser::diagnostic(&local_208,local_3c0,sVar6);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Internal error: Unhandled operand type: ",0x28
                              );
                    std::ostream::operator<<(&local_208,sVar8);
                    sVar7 = local_208.error_;
                    goto LAB_001afd45;
                  case SPV_OPERAND_TYPE_IMAGE:
                  case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
                  case SPV_OPERAND_TYPE_SELECTION_CONTROL:
                  case SPV_OPERAND_TYPE_LOOP_CONTROL:
                  case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
                  case SPV_OPERAND_TYPE_MEMORY_ACCESS:
                  case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
                  case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
                  case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
                  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS:
                  case SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS:
                  case SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS:
                  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_REDUCE:
                  case SPV_OPERAND_TYPE_TENSOR_ADDRESSING_OPERANDS:
                    sVar35 = sVar8;
                    if ((int)sVar8 < 0x4e) {
                      if (sVar8 == SPV_OPERAND_TYPE_OPTIONAL_IMAGE) {
                        sVar35 = SPV_OPERAND_TYPE_IMAGE;
                        local_470.type = sVar35;
                      }
                      else if (sVar8 == SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS) {
                        sVar35 = SPV_OPERAND_TYPE_MEMORY_ACCESS;
                        local_470.type = sVar35;
                      }
                    }
                    else if (sVar8 == SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS) {
                      sVar35 = SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS;
                      local_470.type = sVar35;
                    }
                    else if (sVar8 == SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS) {
                      sVar35 = SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS;
                      local_470.type = sVar35;
                    }
                    if (sVar9 == SPV_OPERAND_TYPE_NONE) {
                      sVar6 = spvtools::AssemblyGrammar::lookupOperand
                                        ((AssemblyGrammar *)local_3e0,sVar8,0,
                                         (spv_operand_desc *)&local_208);
                      if (sVar6 == SPV_SUCCESS) {
                        types = (spv_operand_type_t *)
                                (CONCAT44(local_208._4_4_,local_208._0_4_) + 0x38);
                        goto LAB_001b01f0;
                      }
                    }
                    else {
                      sVar32 = ~SPV_FORCE_32BIT_spv_operand_type_t;
                      do {
                        if ((sVar32 & sVar9) != SPV_OPERAND_TYPE_NONE) {
                          sVar6 = spvtools::AssemblyGrammar::lookupOperand
                                            ((AssemblyGrammar *)local_3e0,sVar8,sVar32,
                                             (spv_operand_desc *)&local_458);
                          if (sVar6 != SPV_SUCCESS) {
                            anon_unknown.dwarf_474aba::Parser::diagnostic
                                      (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_208,"Invalid ",8);
                            local_428 = (Capability *)spvOperandTypeStr(sVar35);
                            pDVar18 = spvtools::DiagnosticStream::operator<<
                                                (&local_208,(char **)&local_428);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)pDVar18," operand: ",10);
                            std::ostream::_M_insert<unsigned_long>((ulong)pDVar18);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)pDVar18," has invalid mask component ",0x1c);
                            goto LAB_001afd33;
                          }
                          sVar9 = sVar9 ^ sVar32;
                          spvPushOperandTypes(local_458->operandTypes + 8,&local_298);
                        }
                        sVar32 = sVar32 >> 1;
                      } while (sVar9 != SPV_OPERAND_TYPE_NONE);
                    }
                  }
                  bVar5 = spvOperandIsConcrete(local_470.type);
                  if (!bVar5) {
                    __assert_fail("spvOperandIsConcrete(parsed_operand.type)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                  ,0x307,
                                  "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                 );
                  }
                  if (local_2c0._M_current == local_2b8) {
                    std::vector<spv_parsed_operand_t,std::allocator<spv_parsed_operand_t>>::
                    _M_realloc_insert<spv_parsed_operand_t_const&>
                              ((vector<spv_parsed_operand_t,std::allocator<spv_parsed_operand_t>> *)
                               &local_2c8,local_2c0,&local_470);
                  }
                  else {
                    (local_2c0._M_current)->offset = local_470.offset;
                    (local_2c0._M_current)->num_words = local_470.num_words;
                    (local_2c0._M_current)->type = local_470.type;
                    (local_2c0._M_current)->number_kind = local_470.number_kind;
                    (local_2c0._M_current)->number_bit_width = local_470.number_bit_width;
                    local_2c0._M_current = local_2c0._M_current + 1;
                  }
                  endian = local_3a0._40_4_;
                  uVar14 = local_3a0._0_8_;
                  pCVar22 = (Capability *)(local_3a0._24_8_ + (ulong)local_470.num_words);
                  if ((ulong)local_3a0._8_8_ < pCVar22) {
                    sVar7 = anon_unknown.dwarf_474aba::Parser::exhaustedInputDiagnostic
                                      ((Parser *)local_3e0,(size_t)local_460,OVar29,sVar8);
                    inst_offset = local_460;
                  }
                  else {
                    if ((local_3a0[0x2c] == true) && ((ulong)local_470.num_words != 0)) {
                      lVar24 = local_3a0._24_8_ * 4;
                      uVar25 = (ulong)local_470.num_words;
                      lVar36 = 0;
                      do {
                        local_208._0_4_ = spvFixWord(*(uint32_t *)(uVar14 + lVar36 + lVar24),endian)
                        ;
                        if (local_2b0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish ==
                            local_2b0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                          _M_realloc_insert<unsigned_int>
                                    (&local_2b0,
                                     (iterator)
                                     local_2b0.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,(uint *)&local_208);
                        }
                        else {
                          *local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish = local_208._0_4_;
                          local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish =
                               local_2b0.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 1;
                        }
                        lVar36 = lVar36 + 4;
                      } while (uVar25 * 4 != lVar36);
                    }
                    sVar7 = SPV_EXT_INST_TYPE_NONE;
                    inst_offset = local_460;
                    local_3a0._24_8_ = pCVar22;
                  }
LAB_001b0314:
                } while (sVar7 == SPV_EXT_INST_TYPE_NONE);
              }
              goto LAB_001afaec;
            }
            sVar7 = SPV_EXT_INST_TYPE_NONE;
            if (local_3a0._24_8_ != local_3a0._8_8_) {
              __assert_fail("_.word_index == _.num_words",
                            "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                            ,0x120,"spv_result_t (anonymous namespace)::Parser::parseModule()");
            }
          }
          goto LAB_001af815;
        }
        anon_unknown.dwarf_474aba::Parser::diagnostic
                  (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
        pcVar31 = "Internal error: unhandled header parse failure";
        lVar24 = 0x2e;
      }
      else {
        anon_unknown.dwarf_474aba::Parser::diagnostic
                  (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Invalid SPIR-V magic number \'",0x1d);
        lVar24 = *(long *)(CONCAT44(local_208._4_4_,local_208._0_4_) + -0x18);
        *(uint *)(&local_208.field_0x18 + lVar24) =
             *(uint *)(&local_208.field_0x18 + lVar24) & 0xffffffb5 | 8;
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        pcVar31 = "\'.";
        lVar24 = 2;
      }
      goto LAB_001af781;
    }
    anon_unknown.dwarf_474aba::Parser::diagnostic
              (&local_208,local_3c0,(spv_result_t)local_3a0._32_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"Module has incomplete header: only ",0x23);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208," words instead of ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
  }
  spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
  sVar7 = local_208.error_;
LAB_001af815:
  anon_unknown.dwarf_474aba::Parser::State::State
            ((State *)&local_208,(uint32_t *)0x0,0,(spv_diagnostic *)0x0);
  anon_unknown.dwarf_474aba::Parser::State::operator=((State *)local_3a0,(State *)&local_208);
  anon_unknown.dwarf_474aba::Parser::State::~State((State *)&local_208);
  anon_unknown.dwarf_474aba::Parser::State::~State((State *)local_3a0);
  if (local_228 != (_Manager_type)0x0) {
    (*local_228)((_Any_data *)(local_258 + 0x20),(_Any_data *)(local_258 + 0x20),__destroy_functor);
  }
  return sVar7;
  while ((p_Var19 = p_Var19->_M_nxt, p_Var19 != (_Hash_node_base *)0x0 &&
         (sVar9 = *(spv_operand_type_t *)&p_Var19[1]._M_nxt,
         (ulong)sVar9 % (ulong)local_3a0._112_8_ == uVar25))) {
joined_r0x001b0ced:
    if (sVar9 == local_408._4_4_) goto LAB_001b0eef;
  }
LAB_001b0d15:
  local_448._16_4_ = iVar34;
  local_3e8 = (uint *)CONCAT44(local_3e8._4_4_,sVar8);
  p_Var19 = (_Hash_node_base *)operator_new(0x18);
  p_Var19->_M_nxt = (_Hash_node_base *)0x0;
  *(undefined4 *)&p_Var19[1]._M_nxt = local_408._4_4_;
  *(undefined8 *)((long)&p_Var19[1]._M_nxt + 4) = 0;
  auVar37 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                      ((ulong)(local_3a0 + 0x88),local_3a0._112_8_,local_3a0._128_8_);
  __n = auVar37._8_8_;
  if ((auVar37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    iVar34 = local_448._16_4_;
  }
  else {
    local_280 = uVar26;
    if (__n == 1) {
      local_3a0._152_8_ = (__node_base_ptr)0x0;
      __s = (_Hash_node_base **)(local_3a0 + 0x98);
    }
    else {
      __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                      ((new_allocator<std::__detail::_Hash_node_base_*> *)&local_208,__n,(void *)0x0
                      );
      memset(__s,0,__n * 8);
    }
    p_Var23 = (_Hash_node_base *)local_3a0._120_8_;
    iVar34 = local_448._16_4_;
    local_3a0._120_8_ = (_Hash_node_base *)0x0;
    if (p_Var23 != (_Hash_node_base *)0x0) {
      uVar25 = 0;
      do {
        p_Var3 = p_Var23->_M_nxt;
        uVar26 = (ulong)*(uint *)&p_Var23[1]._M_nxt % __n;
        if (__s[uVar26] == (_Hash_node_base *)0x0) {
          p_Var23->_M_nxt = (_Hash_node_base *)local_3a0._120_8_;
          __s[uVar26] = (_Hash_node_base *)(local_3a0 + 0x78);
          local_3a0._120_8_ = p_Var23;
          if (p_Var23->_M_nxt != (_Hash_node_base *)0x0) {
            p_Var20 = (_Hash_node_base *)(__s + uVar25);
            goto LAB_001b0e21;
          }
        }
        else {
          p_Var23->_M_nxt = __s[uVar26]->_M_nxt;
          p_Var20 = __s[uVar26];
          uVar26 = uVar25;
LAB_001b0e21:
          p_Var20->_M_nxt = p_Var23;
        }
        p_Var23 = p_Var3;
        uVar25 = uVar26;
      } while (p_Var3 != (_Hash_node_base *)0x0);
    }
    if (local_3a0 + 0x98 != (undefined1 *)local_3a0._104_8_) {
      operator_delete((void *)local_3a0._104_8_,local_3a0._112_8_ << 3);
    }
    uVar25 = local_280 % __n;
    local_3a0._104_8_ = __s;
    local_3a0._112_8_ = __n;
  }
  if (*(_Hash_node_base **)(local_3a0._104_8_ + uVar25 * 8) == (_Hash_node_base *)0x0) {
    p_Var19->_M_nxt = (_Hash_node_base *)local_3a0._120_8_;
    if ((_Hash_node_base *)local_3a0._120_8_ != (_Hash_node_base *)0x0) {
      *(_Hash_node_base **)
       (local_3a0._104_8_ +
       ((ulong)*(uint *)&((_Hash_node_base *)(local_3a0._120_8_ + 8))->_M_nxt %
       (ulong)local_3a0._112_8_) * 8) = p_Var19;
    }
    *(_Hash_node_base **)(local_3a0._104_8_ + uVar25 * 8) = (_Hash_node_base *)(local_3a0 + 0x78);
    local_3a0._120_8_ = p_Var19;
  }
  else {
    p_Var19->_M_nxt = (*(_Hash_node_base **)(local_3a0._104_8_ + uVar25 * 8))->_M_nxt;
    (*(_Hash_node_base **)(local_3a0._104_8_ + uVar25 * 8))->_M_nxt = p_Var19;
  }
  local_3a0._128_8_ = local_3a0._128_8_ + 1;
  sVar8 = (spv_operand_type_t)local_3e8;
  uVar14 = local_408._0_8_;
LAB_001b0eef:
  local_408._0_8_ = uVar14;
  *(int *)((long)&p_Var19[1]._M_nxt + 4) = iVar34;
  *(spv_operand_type_t *)&p_Var19[2]._M_nxt = sVar8;
  inst_offset = local_460;
LAB_001b0efc:
  local_418._0_8_ =
       local_2b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (local_3a0[0x2c] == false) {
    local_418._0_8_ = (uint *)(local_3a0._0_8_ + inst_offset * 4);
  }
  local_418._8_2_ = local_472;
  local_408._8_8_ = local_2c8;
  local_3f8._0_2_ = (uint16_t)((uint)((int)local_2c0._M_current - (int)local_2c8) >> 4);
  if ((local_3a8 == (spv_parsed_instruction_fn_t)0x0) ||
     (sVar7 = (*local_3a8)(local_3b8,(spv_parsed_instruction_t *)local_418),
     sVar7 == SPV_EXT_INST_TYPE_NONE)) {
    sVar7 = SPV_EXT_INST_TYPE_NONE;
  }
LAB_001afaec:
  if (sVar7 != SPV_EXT_INST_TYPE_NONE) goto LAB_001af815;
  goto LAB_001af953;
}

Assistant:

spv_result_t spvBinaryParse(const spv_const_context context, void* user_data,
                            const uint32_t* code, const size_t num_words,
                            spv_parsed_header_fn_t parsed_header,
                            spv_parsed_instruction_fn_t parsed_instruction,
                            spv_diagnostic* diagnostic) {
  spv_context_t hijack_context = *context;
  if (diagnostic) {
    *diagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, diagnostic);
  }
  Parser parser(&hijack_context, user_data, parsed_header, parsed_instruction);
  return parser.parse(code, num_words, diagnostic);
}